

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

BailOutInfo * __thiscall BasicBlock::CreateLoopTopBailOutInfo(BasicBlock *this,GlobOpt *globOpt)

{
  Instr *this_00;
  uint32 bailOutOffset;
  BailOutInfo *this_01;
  
  this_00 = this->firstInstr;
  this_01 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,globOpt->func->m_alloc,0x3d6ef4);
  bailOutOffset = IR::Instr::GetByteCodeOffset(this_00);
  BailOutInfo::BailOutInfo(this_01,bailOutOffset,this_00->m_func);
  this_01->isLoopTopBailOutInfo = true;
  GlobOpt::FillBailOutInfo(globOpt,this,this_01);
  this_01->bailOutOpcode = LoopBodyStart;
  return this_01;
}

Assistant:

BailOutInfo *
BasicBlock::CreateLoopTopBailOutInfo(GlobOpt * globOpt)
{
    IR::Instr * firstInstr = this->GetFirstInstr();
    BailOutInfo* bailOutInfo = JitAnew(globOpt->func->m_alloc, BailOutInfo, firstInstr->GetByteCodeOffset(), firstInstr->m_func);
    bailOutInfo->isLoopTopBailOutInfo = true;
    globOpt->FillBailOutInfo(this, bailOutInfo);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = Js::OpCode::LoopBodyStart;
#endif
    return bailOutInfo;
}